

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * despot::util::tinyxml::TiXmlBase::GetEntity
                 (char *p,char *value,int *length,TiXmlEncoding encoding)

{
  size_t sVar1;
  int iVar2;
  char *local_68;
  char *q_1;
  char *q;
  long lStack_50;
  uint mult;
  ptrdiff_t delta;
  unsigned_long ucs;
  int i;
  TiXmlString ent;
  TiXmlEncoding encoding_local;
  int *length_local;
  char *value_local;
  char *p_local;
  
  ent.rep_._4_4_ = encoding;
  TiXmlString::TiXmlString((TiXmlString *)&stack0xffffffffffffffc8);
  *length = 0;
  if (((p[1] == '\0') || (p[1] != '#')) || (p[2] == '\0')) {
    for (ucs._4_4_ = 0; ucs._4_4_ < 5; ucs._4_4_ = ucs._4_4_ + 1) {
      iVar2 = strncmp((&entity)[(long)ucs._4_4_ * 2],p,
                      (ulong)(uint)(&DAT_00278a08)[(long)ucs._4_4_ * 4]);
      if (iVar2 == 0) {
        sVar1 = strlen((&entity)[(long)ucs._4_4_ * 2]);
        if (sVar1 != (uint)(&DAT_00278a08)[(long)ucs._4_4_ * 4]) {
          __assert_fail("strlen(entity[i].str) == entity[i].strLength",
                        "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                        ,0x1df,
                        "static const char *despot::util::tinyxml::TiXmlBase::GetEntity(const char *, char *, int *, TiXmlEncoding)"
                       );
        }
        *value = (&DAT_00278a0c)[(long)ucs._4_4_ * 0x10];
        *length = 1;
        p_local = p + (uint)(&DAT_00278a08)[(long)ucs._4_4_ * 4];
        goto LAB_00231848;
      }
    }
    *value = *p;
    p_local = p + 1;
    goto LAB_00231848;
  }
  delta = 0;
  q._4_4_ = 1;
  if (p[2] == 'x') {
    if (p[3] == '\0') {
      p_local = (char *)0x0;
      goto LAB_00231848;
    }
    q_1 = strchr(p + 3,0x3b);
    if ((q_1 == (char *)0x0) || (*q_1 == '\0')) {
      p_local = (char *)0x0;
      goto LAB_00231848;
    }
    lStack_50 = (long)q_1 - (long)p;
    while (q_1 = q_1 + -1, *q_1 != 'x') {
      if ((*q_1 < '0') || ('9' < *q_1)) {
        if ((*q_1 < 'a') || ('f' < *q_1)) {
          if ((*q_1 < 'A') || ('F' < *q_1)) {
            p_local = (char *)0x0;
            goto LAB_00231848;
          }
          iVar2 = *q_1 + -0x37;
        }
        else {
          iVar2 = *q_1 + -0x57;
        }
      }
      else {
        iVar2 = *q_1 + -0x30;
      }
      delta = (ulong)(uint)(q._4_4_ * iVar2) + delta;
      q._4_4_ = q._4_4_ << 4;
    }
  }
  else {
    if (p[2] == '\0') {
      p_local = (char *)0x0;
      goto LAB_00231848;
    }
    local_68 = strchr(p + 2,0x3b);
    if ((local_68 == (char *)0x0) || (*local_68 == '\0')) {
      p_local = (char *)0x0;
      goto LAB_00231848;
    }
    lStack_50 = (long)local_68 - (long)p;
    while (local_68 = local_68 + -1, *local_68 != '#') {
      if ((*local_68 < '0') || ('9' < *local_68)) {
        p_local = (char *)0x0;
        goto LAB_00231848;
      }
      delta = (ulong)(uint)(q._4_4_ * (*local_68 + -0x30)) + delta;
      q._4_4_ = q._4_4_ * 10;
    }
  }
  if (ent.rep_._4_4_ == TIXML_ENCODING_UTF8) {
    ConvertUTF32ToUTF8(delta,value,length);
  }
  else {
    *value = (char)delta;
    *length = 1;
  }
  p_local = p + lStack_50 + 1;
LAB_00231848:
  TiXmlString::~TiXmlString((TiXmlString *)&stack0xffffffffffffffc8);
  return p_local;
}

Assistant:

const char* TiXmlBase::GetEntity(const char* p, char* value, int* length,
	TiXmlEncoding encoding) {
	// Presume an entity, and pull it out.
	TIXML_STRING ent;
	int i;
	*length = 0;

	if (*(p + 1) && *(p + 1) == '#' && *(p + 2)) {
		unsigned long ucs = 0;
		ptrdiff_t delta = 0;
		unsigned mult = 1;

		if (*(p + 2) == 'x') {
			// Hexadecimal.
			if (!*(p + 3))
				return 0;

			const char* q = p + 3;
			q = strchr(q, ';');

			if (!q || !*q)
				return 0;

			delta = q - p;
			--q;

			while (*q != 'x') {
				if (*q >= '0' && *q <= '9')
					ucs += mult * (*q - '0');
				else if (*q >= 'a' && *q <= 'f')
					ucs += mult * (*q - 'a' + 10);
				else if (*q >= 'A' && *q <= 'F')
					ucs += mult * (*q - 'A' + 10);
				else
					return 0;
				mult *= 16;
				--q;
			}
		} else {
			// Decimal.
			if (!*(p + 2))
				return 0;

			const char* q = p + 2;
			q = strchr(q, ';');

			if (!q || !*q)
				return 0;

			delta = q - p;
			--q;

			while (*q != '#') {
				if (*q >= '0' && *q <= '9')
					ucs += mult * (*q - '0');
				else
					return 0;
				mult *= 10;
				--q;
			}
		}
		if (encoding == TIXML_ENCODING_UTF8) {
			// convert the UCS to UTF-8
			ConvertUTF32ToUTF8(ucs, value, length);
		} else {
			*value = (char) ucs;
			*length = 1;
		}
		return p + delta + 1;
	}

	// Now try to match it.
	for (i = 0; i < NUM_ENTITY; ++i) {
		if (strncmp(entity[i].str, p, entity[i].strLength) == 0) {
			assert(strlen(entity[i].str) == entity[i].strLength);
			*value = entity[i].chr;
			*length = 1;
			return (p + entity[i].strLength);
		}
	}

	// So it wasn't an entity, its unrecognized, or something like that.
	*value = *p; // Don't put back the last one, since we return it!
	//*length = 1;	// Leave unrecognized entities - this doesn't really work.
	// Just writes strange XML.
	return p + 1;
}